

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

void calc_free(borg_calculation *calc)

{
  int local_14;
  int i;
  borg_calculation *calc_local;
  
  if (calc->token_array != (borg_array *)0x0) {
    for (local_14 = 0; local_14 < calc->token_array->count; local_14 = local_14 + 1) {
      token_free((token *)calc->token_array->items[local_14]);
      calc->token_array->items[local_14] = (void *)0x0;
    }
    mem_free(calc->token_array);
    calc->token_array = (borg_array *)0x0;
  }
  mem_free(calc);
  return;
}

Assistant:

static void calc_free(struct borg_calculation *calc)
{
    if (calc->token_array) {
        for (int i = 0; i < calc->token_array->count; i++) {
            token_free(calc->token_array->items[i]);
            calc->token_array->items[i] = NULL;
        }
        mem_free(calc->token_array);
        calc->token_array = NULL;
    }
    mem_free(calc);
    calc = NULL;
}